

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O3

void __thiscall Fl_Button::setonly(Fl_Button *this)

{
  int iVar1;
  Fl_Group *this_00;
  Fl_Button *this_01;
  Fl_Widget **ppFVar2;
  long lVar3;
  
  value(this,1);
  this_00 = (this->super_Fl_Widget).parent_;
  ppFVar2 = Fl_Group::array(this_00);
  iVar1 = this_00->children_;
  if (iVar1 != 0) {
    lVar3 = 0;
    do {
      this_01 = (Fl_Button *)ppFVar2[lVar3];
      if ((this_01 != this) && ((this_01->super_Fl_Widget).type_ == 'f')) {
        value(this_01,0);
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void Fl_Button::setonly() { // set this radio button on, turn others off
  value(1);
  Fl_Group* g = parent();
  Fl_Widget*const* a = g->array();
  for (int i = g->children(); i--;) {
    Fl_Widget* o = *a++;
    if (o != this && o->type()==FL_RADIO_BUTTON) ((Fl_Button*)o)->value(0);
  }
}